

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webpinfo.c
# Opt level: O1

WebPInfoStatus
ParseLossyFilterHeader(WebPInfo *webp_info,uint8_t *data,size_t data_size,uint64_t *bit_pos)

{
  uint8_t uVar1;
  int iVar2;
  ulong uVar3;
  byte bVar4;
  ulong uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  
  uVar9 = *bit_pos;
  *bit_pos = uVar9 + 1;
  if (uVar9 >> 3 < data_size) {
    uVar1 = data[uVar9 >> 3];
    uVar13 = 0;
    lVar12 = -6;
    uVar5 = uVar9 + 1;
    do {
      uVar3 = uVar5;
      *bit_pos = uVar3 + 1;
      uVar11 = uVar3 >> 3;
      if (data_size <= uVar11) break;
      uVar13 = (uint)((byte)(data[uVar11] << ((byte)uVar3 & 7)) >> 7) + uVar13 * 2;
      lVar12 = lVar12 + 1;
      uVar5 = uVar3 + 1;
    } while (lVar12 != 0);
    if (uVar11 < data_size) {
      uVar8 = 0;
      lVar12 = -3;
      uVar5 = uVar3 + 1;
      do {
        uVar3 = uVar5;
        *bit_pos = uVar3 + 1;
        uVar11 = uVar3 >> 3;
        if (data_size <= uVar11) break;
        uVar8 = (uint)((byte)(data[uVar11] << ((byte)uVar3 & 7)) >> 7) + uVar8 * 2;
        lVar12 = lVar12 + 1;
        uVar5 = uVar3 + 1;
      } while (lVar12 != 0);
      if (uVar11 < data_size) {
        uVar5 = uVar3 + 1 >> 3;
        *bit_pos = uVar3 + 2;
        if (uVar5 < data_size) {
          uVar10 = (uint)((byte)(data[uVar5] << ((byte)uVar3 + 1 & 7)) >> 7);
          printf("  Simple filter:    %d\n",(ulong)((byte)(uVar1 << ((byte)uVar9 & 7)) >> 7));
          printf("  Level:            %d\n",(ulong)uVar13);
          printf("  Sharpness:        %d\n",(ulong)uVar8);
          printf("  Use lf delta:     %d\n",(ulong)uVar10);
          if (uVar10 == 0) {
            return WEBP_INFO_OK;
          }
          uVar9 = *bit_pos;
          *bit_pos = uVar9 + 1;
          if (uVar9 >> 3 < data_size) {
            uVar13 = (uint)((byte)(data[uVar9 >> 3] << ((byte)uVar9 & 7)) >> 7);
            printf("  Update lf delta:  %d\n",(ulong)uVar13);
            if (uVar13 == 0) {
              return WEBP_INFO_OK;
            }
            uVar7 = *bit_pos;
            iVar2 = 0;
            while( true ) {
              uVar6 = uVar7 + 1;
              uVar9 = uVar7 >> 3;
              *bit_pos = uVar6;
              if (data_size <= uVar9) break;
              bVar4 = (byte)uVar7;
              uVar7 = uVar6;
              if ((char)(data[uVar9] << (bVar4 & 7)) < '\0') {
                lVar12 = -7;
                do {
                  uVar7 = uVar6 + 1;
                  uVar9 = uVar6 >> 3;
                  if (data_size <= uVar9) {
                    *bit_pos = uVar7;
                    goto LAB_0010521a;
                  }
                  lVar12 = lVar12 + 1;
                  uVar6 = uVar7;
                } while (lVar12 != 0);
                *bit_pos = uVar7;
                if (data_size <= uVar9) break;
              }
              iVar2 = iVar2 + 1;
              if (iVar2 == 8) {
                return WEBP_INFO_OK;
              }
            }
LAB_0010521a:
            iVar2 = webp_info->show_diagnosis;
          }
          else {
            iVar2 = webp_info->show_diagnosis;
          }
          goto joined_r0x00105224;
        }
      }
    }
  }
  iVar2 = webp_info->show_diagnosis;
joined_r0x00105224:
  if (iVar2 != 0) {
    ParseLossyFilterHeader_cold_1();
  }
  return WEBP_INFO_TRUNCATED_DATA;
}

Assistant:

static WebPInfoStatus ParseLossyFilterHeader(const WebPInfo* const webp_info,
                                             const uint8_t* const data,
                                             size_t data_size,
                                             uint64_t* const bit_pos) {
  int simple_filter, level, sharpness, use_lf_delta;
  GET_BITS(simple_filter, 1);
  GET_BITS(level, 6);
  GET_BITS(sharpness, 3);
  GET_BITS(use_lf_delta, 1);
  printf("  Simple filter:    %d\n", simple_filter);
  printf("  Level:            %d\n", level);
  printf("  Sharpness:        %d\n", sharpness);
  printf("  Use lf delta:     %d\n", use_lf_delta);
  if (use_lf_delta) {
    int update;
    GET_BITS(update, 1);
    printf("  Update lf delta:  %d\n", update);
    if (update) {
      int i;
      for (i = 0; i < 4 + 4; ++i) {
        int temp;
        GET_BITS(temp, 1);
        if (temp) GET_BITS(temp, 7);
      }
    }
  }
  return WEBP_INFO_OK;
}